

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_impl.hpp
# Opt level: O2

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall
toml::detail::region::as_lines_abi_cxx11_
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *__return_storage_ptr__,region *this)

{
  element_type *peVar1;
  pointer puVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  begin;
  long lVar3;
  pointer puVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *this_00;
  const_iterator begin_00;
  long lVar5;
  const_iterator end_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l_02;
  allocator_type local_112;
  char_type lf;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  first_line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  last_line;
  pair<const_char_*,_int> local_40;
  
  if (this->length_ == 0) {
    first_line.first._M_dataplus._M_p = "";
    first_line.first._M_string_length = 0;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_*,_unsigned_long,_true>
              (&local_e0,(pair<const_char_*,_unsigned_long> *)&first_line);
    __l_00._M_len = 1;
    __l_00._M_array = &local_e0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::vector(__return_storage_ptr__,__l_00,(allocator_type *)&last_line);
  }
  else {
    peVar1 = (this->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    begin_00._M_current = (uchar *)(this->first_ + lVar3);
    end_00._M_current = (uchar *)(lVar3 + this->last_ + -1);
    if (this->first_line_ != this->last_line_) {
      puVar2 = (peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar4 = begin_00._M_current + 0x32;
      if ((long)puVar2 - (long)begin_00._M_current < 0x3d) {
        puVar4 = puVar2;
      }
      lVar5 = this->last_ + lVar3 + -0x33;
      if ((long)end_00._M_current - lVar3 < 0x3d) {
        lVar5 = lVar3;
      }
      lf = '\n';
      local_110 = __return_storage_ptr__;
      end = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                      (begin_00._M_current,puVar4,&lf);
      begin = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                        (lVar5,end_00._M_current,&lf);
      take_line_abi_cxx11_(&first_line,this,begin_00,(const_iterator)end._M_current);
      take_line_abi_cxx11_(&last_line,this,(const_iterator)begin._M_current,end_00);
      if (this->first_line_ + 1 == this->last_line_) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair(&local_e0,&first_line);
        __return_storage_ptr__ = local_110;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair(&local_b8,&last_line);
        __l_01._M_len = 2;
        __l_01._M_array = &local_e0;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::vector(__return_storage_ptr__,__l_01,(allocator_type *)&local_40);
        lVar3 = 0x28;
        do {
          std::__cxx11::string::~string((string *)((long)&local_e0.first._M_dataplus._M_p + lVar3));
          lVar3 = lVar3 + -0x28;
        } while (lVar3 != -0x28);
      }
      else {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair(&local_e0,&first_line);
        __return_storage_ptr__ = local_110;
        local_40.first = "...";
        local_40.second = 0;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair<const_char_*,_int,_true>(&local_b8,&local_40);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair(&local_90,&last_line);
        __l_02._M_len = 3;
        __l_02._M_array = &local_e0;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::vector(__return_storage_ptr__,__l_02,&local_112);
        lVar3 = 0x50;
        do {
          std::__cxx11::string::~string((string *)((long)&local_e0.first._M_dataplus._M_p + lVar3));
          lVar3 = lVar3 + -0x28;
        } while (lVar3 != -0x28);
      }
      std::__cxx11::string::~string((string *)&last_line);
      this_00 = &first_line;
      goto LAB_001a8295;
    }
    take_line_abi_cxx11_(&local_e0,this,begin_00,end_00);
    __l._M_len = 1;
    __l._M_array = &local_e0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::vector(__return_storage_ptr__,__l,(allocator_type *)&first_line);
  }
  this_00 = &local_e0;
LAB_001a8295:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::vector<std::pair<std::string, std::size_t>> region::as_lines() const
{
    assert(this->is_ok());
    if(this->length_ == 0)
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            std::make_pair("", std::size_t(0))
        };
    }

    // Consider the following toml file
    // ```
    // array = [
    //   1, 2, 3,
    // ] # comment
    // ```
    // and the region represnets
    // ```
    //         [
    //   1, 2, 3,
    // ]
    // ```
    // but we want to show the following.
    // ```
    // array = [
    //   1, 2, 3,
    // ] # comment
    // ```
    // So we need to find LFs before `begin` and after `end`.
    //
    // But, if region ends with LF, it should not include the next line.
    // ```
    // a = 42
    //     ^^^- with the last LF
    // ```
    // So we start from `end-1` when looking for LF.

    const auto begin_idx = static_cast<difference_type>(this->first_);
    const auto end_idx   = static_cast<difference_type>(this->last_) - 1;

    // length_ != 0, so begin < end. then begin <= end-1
    assert(begin_idx <= end_idx);

    const auto begin = std::next(this->source_->cbegin(), begin_idx);
    const auto end   = std::next(this->source_->cbegin(), end_idx);

    assert(this->first_line_number() <= this->last_line_number());

    if(this->first_line_number() == this->last_line_number())
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            this->take_line(begin, end)
        };
    }

    // we have multiple lines. `begin` and `end` points different lines.
    // that means that there is at least one `LF` between `begin` and `end`.

    const auto after_begin = std::distance(begin, this->source_->cend());
    const auto before_end  = std::distance(this->source_->cbegin(), end);

    const_iterator capped_file_end   = this->source_->cend();
    const_iterator capped_file_begin = this->source_->cbegin();
    if(60 < after_begin) {capped_file_end   = std::next(begin, 50);}
    if(60 < before_end)  {capped_file_begin = std::prev(end,   50);}

    const auto lf = char_type('\n');
    const auto first_line_end  = std::find(begin, capped_file_end, lf);
    const auto last_line_begin = std::find(capped_file_begin, end, lf);

    const auto first_line = this->take_line(begin, first_line_end);
    const auto last_line  = this->take_line(last_line_begin, end);

    if(this->first_line_number() + 1 == this->last_line_number())
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            first_line, last_line
        };
    }
    else
    {
        return std::vector<std::pair<std::string, std::size_t>>{
            first_line, std::make_pair("...", 0), last_line
        };
    }
}